

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_lang(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  int iVar1;
  lyd_node *root;
  lyd_attr *plVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  lyxp_set_attrs *__ptr;
  long lVar5;
  lys_ext_instance_complex *plVar6;
  char cVar7;
  
  iVar1 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
  if (iVar1 != 0) {
    return -1;
  }
  switch(set->type) {
  case LYXP_SET_EMPTY:
    goto switchD_0016e6c6_caseD_0;
  case LYXP_SET_NODE_SET:
    __ptr = (set->val).attrs;
    if (__ptr->type - LYXP_NODE_ELEM < 2) {
      plVar2 = __ptr->attr;
joined_r0x0016e746:
      for (; plVar2 != (lyd_attr *)0x0; plVar2 = (lyd_attr *)(plVar2->value).enm) {
        for (plVar6 = plVar2->annotation; plVar6 != (lys_ext_instance_complex *)0x0;
            plVar6 = (lys_ext_instance_complex *)plVar6->parent) {
          if (((*(char **)&plVar6->flags != (char *)0x0) &&
              (iVar1 = strcmp(*(char **)&plVar6->flags,"lang"), iVar1 == 0)) &&
             (iVar1 = strcmp(((lys_ext_instance_complex *)plVar6->arg_value)->module->name,"xml"),
             iVar1 == 0)) {
            pcVar4 = ((*args)->val).str;
            cVar7 = *pcVar4;
            if (cVar7 == '\0') {
              lVar5 = 0;
              goto LAB_0016e820;
            }
            pp_Var3 = __ctype_tolower_loc();
            lVar5 = 0;
            goto LAB_0016e7c5;
          }
        }
      }
      goto LAB_0016e854;
    }
    if (__ptr->type == LYXP_NODE_ATTR) {
      root = moveto_get_root(cur_node,options,(lyxp_node_type *)0x0);
      plVar2 = (lyd_attr *)lyd_attr_parent(root,__ptr->attr);
      goto joined_r0x0016e746;
    }
    goto LAB_0016e862;
  case LYXP_SET_SNODE_SET:
    pcVar4 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar4 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar4 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar4 = "string";
    break;
  default:
    pcVar4 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar4,"lang(string)");
  return -1;
  while( true ) {
    cVar7 = pcVar4[lVar5 + 1];
    lVar5 = lVar5 + 1;
    if (cVar7 == '\0') break;
LAB_0016e7c5:
    if ((*pp_Var3)[cVar7] != (*pp_Var3)[*(char *)((long)plVar6->ext + lVar5)]) {
      if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
        free((set->val).nodes);
      }
      set->type = LYXP_SET_BOOLEAN;
      (set->val).bool = 0;
      if (*(char *)((long)&(((*args)->val).nodes)->node + lVar5) != '\0') {
        return 0;
      }
      break;
    }
  }
LAB_0016e820:
  cVar7 = *(char *)((long)plVar6->ext + lVar5);
  if ((cVar7 == '-') || (cVar7 == '\0')) {
    if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
      free((set->val).nodes);
    }
    set->type = LYXP_SET_BOOLEAN;
    (set->val).bool = 1;
    return 0;
  }
LAB_0016e854:
  if ((set->type | LYXP_SET_NUMBER) != LYXP_SET_STRING) goto switchD_0016e6c6_caseD_0;
  __ptr = (lyxp_set_attrs *)(set->val).nodes;
LAB_0016e862:
  free(__ptr);
switchD_0016e6c6_caseD_0:
  set->type = LYXP_SET_BOOLEAN;
  (set->val).bool = 0;
  return 0;
}

Assistant:

static int
xpath_lang(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
           struct lyxp_set *set, int options)
{
    const struct lyd_node *node, *root;
    struct lyd_attr *attr = NULL;
    int i;

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    if (set->type == LYXP_SET_EMPTY) {
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "lang(string)");
        return -1;
    }

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        node = set->val.nodes[0].node;
        break;
    case LYXP_NODE_ATTR:
        root = moveto_get_root(cur_node, options, NULL);
        node = lyd_attr_parent(root, set->val.attrs[0].attr);
        break;
    default:
        /* nothing to do with roots */
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }

    /* find lang attribute */
    for (; node; node = node->parent) {
        for (attr = node->attr; attr; attr = attr->next) {
            if (attr->name && !strcmp(attr->name, "lang") && !strcmp(attr->annotation->module->name, "xml")) {
                break;
            }
        }

        if (attr) {
            break;
        }
    }

    /* compare languages */
    if (!attr) {
        set_fill_boolean(set, 0);
    } else {
        for (i = 0; args[0]->val.str[i]; ++i) {
            if (tolower(args[0]->val.str[i]) != tolower(attr->value_str[i])) {
                set_fill_boolean(set, 0);
                break;
            }
        }
        if (!args[0]->val.str[i]) {
            if (!attr->value_str[i] || (attr->value_str[i] == '-')) {
                set_fill_boolean(set, 1);
            } else {
                set_fill_boolean(set, 0);
            }
        }
    }

    return EXIT_SUCCESS;
}